

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O3

bool __thiscall
HighsPrimalHeuristics::linesearchRounding
          (HighsPrimalHeuristics *this,vector<double,_std::allocator<double>_> *point1,
          vector<double,_std::allocator<double>_> *point2,int solution_source)

{
  double dVar1;
  pointer piVar2;
  pointer piVar3;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var4;
  long lVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  bool bVar9;
  bool bVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  vector<double,_std::allocator<double>_> roundedpoint;
  double local_a8;
  vector<double,_std::allocator<double>_> local_48;
  
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  piVar2 = (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar3 = (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<double,_std::allocator<double>_>::resize
            (&local_48,(long)this->mipsolver->model_->num_col_);
  uVar13 = (ulong)((long)piVar2 - (long)piVar3) >> 2;
  dVar15 = 0.0;
  do {
    pdVar8 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (1.0 <= dVar15) {
      bVar10 = false;
      break;
    }
    if ((int)uVar13 == 0) {
      bVar9 = true;
      local_a8 = 1.0;
    }
    else {
      piVar2 = (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      _Var4._M_head_impl =
           (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      lVar5 = *(long *)&((_Var4._M_head_impl)->uplocks).
                        super__Vector_base<int,_std::allocator<int>_>;
      pdVar6 = (point1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (point2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar9 = true;
      uVar12 = 0;
      local_a8 = 1.0;
      do {
        lVar11 = (long)piVar2[uVar12];
        if (*(int *)(lVar5 + lVar11 * 4) == 0) {
          dVar17 = pdVar7[lVar11];
          if (pdVar7[lVar11] <= pdVar6[lVar11]) {
            dVar17 = pdVar6[lVar11];
          }
          dVar17 = ceil(dVar17 - (_Var4._M_head_impl)->feastol);
LAB_002d54bf:
          pdVar8[lVar11] = dVar17;
        }
        else {
          if (*(int *)(*(long *)&((_Var4._M_head_impl)->downlocks).
                                 super__Vector_base<int,_std::allocator<int>_> + lVar11 * 4) == 0) {
            dVar17 = pdVar7[lVar11];
            if (pdVar6[lVar11] <= pdVar7[lVar11]) {
              dVar17 = pdVar6[lVar11];
            }
            dVar17 = floor(dVar17 + (_Var4._M_head_impl)->feastol);
            goto LAB_002d54bf;
          }
          dVar17 = pdVar7[lVar11];
          dVar1 = pdVar6[lVar11];
          dVar16 = floor(dVar17 + 0.5);
          dVar17 = floor(dVar1 * (1.0 - dVar15) + dVar15 * dVar17 + 0.5);
          pdVar8[lVar11] = dVar17;
          if ((dVar17 != dVar16) || (NAN(dVar17) || NAN(dVar16))) {
            dVar17 = ((dVar17 + 0.5 + (_Var4._M_head_impl)->feastol) - pdVar6[lVar11]) /
                     ABS(pdVar7[lVar11] - pdVar6[lVar11]);
            uVar14 = -(ulong)(dVar15 + 0.01 < dVar17);
            local_a8 = (double)(~-(ulong)(dVar17 < local_a8) & (ulong)local_a8 |
                               (~uVar14 & (ulong)local_a8 | uVar14 & (ulong)dVar17) &
                               -(ulong)(dVar17 < local_a8));
            bVar9 = false;
          }
        }
        uVar12 = uVar12 + 1;
      } while ((uVar13 & 0xffffffff) != uVar12);
    }
    bVar10 = tryRoundedPoint(this,&local_48,solution_source);
    dVar15 = local_a8;
  } while (!bVar9 && !bVar10);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar10;
}

Assistant:

bool HighsPrimalHeuristics::linesearchRounding(
    const std::vector<double>& point1, const std::vector<double>& point2,
    const int solution_source) {
  std::vector<double> roundedpoint;

  HighsInt numintcols = intcols.size();
  roundedpoint.resize(mipsolver.numCol());

  double alpha = 0.0;
  assert(int(mipsolver.mipdata_->uplocks.size()) == mipsolver.numCol());
  assert(int(point1.size()) == mipsolver.numCol());
  assert(int(point2.size()) == mipsolver.numCol());

  while (alpha < 1.0) {
    double nextalpha = 1.0;
    bool reachedpoint2 = true;
    // printf("trying alpha = %g\n", alpha);
    for (HighsInt i = 0; i != numintcols; ++i) {
      HighsInt col = intcols[i];
      assert(col >= 0);
      assert(col < mipsolver.numCol());
      if (mipsolver.mipdata_->uplocks[col] == 0) {
        roundedpoint[col] = std::ceil(std::max(point1[col], point2[col]) -
                                      mipsolver.mipdata_->feastol);
        continue;
      }

      if (mipsolver.mipdata_->downlocks[col] == 0) {
        roundedpoint[col] = std::floor(std::min(point1[col], point2[col]) +
                                       mipsolver.mipdata_->feastol);
        continue;
      }

      double convexcomb = (1.0 - alpha) * point1[col] + alpha * point2[col];
      double intpoint2 = std::floor(point2[col] + 0.5);
      roundedpoint[col] = std::floor(convexcomb + 0.5);

      if (roundedpoint[col] == intpoint2) continue;

      reachedpoint2 = false;
      double tmpalpha = (roundedpoint[col] + 0.5 + mipsolver.mipdata_->feastol -
                         point1[col]) /
                        std::abs(point2[col] - point1[col]);
      if (tmpalpha < nextalpha && tmpalpha > alpha + 1e-2) nextalpha = tmpalpha;
    }

    if (tryRoundedPoint(roundedpoint, solution_source)) return true;

    if (reachedpoint2) return false;

    alpha = nextalpha;
  }

  return false;
}